

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Nf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Gia_Man_t *pNew;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Jf_Par_t Pars;
  char Buffer [200];
  
  Nf_ManSetDefaultPars(&Pars);
  Extra_UtilGetoptReset();
LAB_00253b0b:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFARLEDQWakpqfvwh");
  iVar4 = globalUtilOptind;
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      goto LAB_00253db1;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nRoundsEla = iVar1;
    break;
  case 0x42:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    goto switchD_00253b28_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by a positive integer.\n";
      goto LAB_00253db1;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    Pars.nCutNum = uVar2;
    if (((int)uVar2 < 1) || (Pars.nCutNumMax < (int)uVar2)) {
      pcVar5 = "This number of cuts (%d) is not supported.\n";
      goto LAB_00253de5;
    }
    goto LAB_00253b0b;
  case 0x44:
    if (argc <= globalUtilOptind) {
LAB_00253d74:
      pcVar5 = "Command line switch \"-D\" should be followed by an integer number.\n";
LAB_00253db1:
      Abc_Print(-1,pcVar5);
      goto switchD_00253b28_caseD_42;
    }
    Pars.DelayTarget = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if (Pars.DelayTarget < 1) goto LAB_00253df5;
    goto LAB_00253b0b;
  case 0x45:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-E\" should be followed by an integer number.\n";
      goto LAB_00253dc4;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nAreaTuner = iVar1;
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      goto LAB_00253db1;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nRounds = iVar1;
    break;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-K\" should be followed by a positive integer.\n";
      goto LAB_00253db1;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    Pars.nLutSize = uVar2;
    if (((int)uVar2 < 2) || (Pars.nLutSizeMax < (int)uVar2)) {
      pcVar5 = "LUT size %d is not supported.\n";
LAB_00253de5:
      globalUtilOptind = iVar4 + 1;
      Abc_Print(-1,pcVar5,(ulong)uVar2);
switchD_00253b28_caseD_42:
LAB_00253df5:
      if (Pars.DelayTarget == -1) {
        builtin_strncpy(Buffer + 8,"sible",6);
        builtin_strncpy(Buffer,"best pos",8);
      }
      else {
        sprintf(Buffer,"%d",(ulong)(uint)Pars.DelayTarget);
      }
      iVar4 = -2;
      Abc_Print(-2,"usage: &nf [-KCFARLEDQ num] [-akpqfvwh]\n");
      Abc_Print(-2,"\t           performs technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                (ulong)(uint)Pars.nLutSizeMax,(ulong)(uint)Pars.nLutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                (ulong)(uint)Pars.nCutNumMax,(ulong)(uint)Pars.nCutNum);
      Abc_Print(-2,"\t-F num   : the number of area flow rounds [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      Abc_Print(-2,
                "\t-A num   : the number of exact area rounds (when \'-a\' is used) [default = %d]\n"
                ,(ulong)(uint)Pars.nRoundsEla);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)Pars.nRelaxRatio);
      Abc_Print(-2,
                "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",
                (ulong)(uint)Pars.nCoarseLimit);
      Abc_Print(-2,
                "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",
                (ulong)(uint)Pars.nAreaTuner);
      Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",Buffer)
      ;
      Abc_Print(-2,"\t-Q num   : internal parameter impacting area of the mapping [default = %d]\n",
                (ulong)(uint)Pars.nReqTimeFlex);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (Pars.fAreaOnly == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-a       : toggles SAT-based area-oriented mapping (experimental) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (Pars.fCoarsen == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fPinPerm == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-p       : toggles pin permutation (more matches - better quality) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (Pars.fPinQuick == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-q       : toggles quick mapping (fewer matches - worse quality) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (Pars.fPinFilter == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-f       : toggles filtering matches (useful with unit delay model) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar5);
      if (Pars.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar6);
      pcVar5 = "\t-h       : prints the command usage\n";
LAB_00254002:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
    goto LAB_00253b0b;
  case 0x4c:
    if (argc <= globalUtilOptind) {
LAB_00253d7d:
      pcVar5 = "Command line switch \"-R\" should be followed by an integer number.\n";
LAB_00253dc4:
      Abc_Print(1,pcVar5);
      return 0;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nCoarseLimit = iVar1;
    break;
  case 0x51:
    if (argc <= globalUtilOptind) goto LAB_00253d74;
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nReqTimeFlex = iVar1;
    break;
  case 0x52:
    if (argc <= globalUtilOptind) goto LAB_00253d7d;
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nRelaxRatio = iVar1;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-W\" should be followed by a positive integer.\n";
      goto LAB_00253db1;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nVerbLimit = iVar1;
    break;
  default:
    switch(iVar1) {
    case 0x70:
      Pars.fPinPerm = Pars.fPinPerm ^ 1;
      break;
    case 0x71:
      Pars.fPinQuick = Pars.fPinQuick ^ 1;
      break;
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
      goto switchD_00253b28_caseD_42;
    case 0x76:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      break;
    case 0x77:
      Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
      break;
    default:
      if (iVar1 == 0x61) {
        Pars.fAreaOnly = Pars.fAreaOnly ^ 1;
      }
      else if (iVar1 == 0x66) {
        Pars.fPinFilter = Pars.fPinFilter ^ 1;
      }
      else {
        if (iVar1 != 0x6b) {
          if (iVar1 != -1) goto switchD_00253b28_caseD_42;
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            pcVar5 = "Empty GIA network.\n";
          }
          else {
            pvVar3 = Abc_FrameReadLibGen();
            if (pvVar3 == (void *)0x0) {
              pcVar5 = "Current library is not available.\n";
            }
            else {
              pNew = Nf_ManPerformMapping(pAbc->pGia,&Pars);
              if (pNew != (Gia_Man_t *)0x0) {
                Abc_FrameUpdateGia(pAbc,pNew);
                return 0;
              }
              pcVar5 = "Abc_CommandAbc9Nf(): Mapping into LUTs has failed.\n";
            }
          }
          iVar4 = -1;
          goto LAB_00254002;
        }
        Pars.fCoarsen = Pars.fCoarsen ^ 1;
      }
    }
    goto LAB_00253b0b;
  }
  globalUtilOptind = iVar4 + 1;
  if (iVar1 < 0) goto switchD_00253b28_caseD_42;
  goto LAB_00253b0b;
}

Assistant:

int Abc_CommandAbc9Nf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Nf_ManSetDefaultPars( Jf_Par_t * pPars );
    extern Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    extern Gia_Man_t * Pf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Nf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFARLEDQWakpqfvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRoundsEla = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRoundsEla < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by an integer number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by an integer number.\n" );
                return 0;
            }
            pPars->nCoarseLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCoarseLimit < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-E\" should be followed by an integer number.\n" );
                return 0;
            }
            pPars->nAreaTuner = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaTuner < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer number.\n" );
                goto usage;
            }
            pPars->nReqTimeFlex = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nReqTimeFlex < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'p':
            pPars->fPinPerm ^= 1;
            break;
        case 'q':
            pPars->fPinQuick ^= 1;
            break;
        case 'f':
            pPars->fPinFilter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        Abc_Print( -1, "Current library is not available.\n" );
        return 1;
    }
//    if ( pPars->fAreaOnly )
//        pNew = Pf_ManPerformMapping( pAbc->pGia, pPars );
//    else
        pNew = Nf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Nf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &nf [-KCFARLEDQ num] [-akpqfvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",                  pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",           pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-F num   : the number of area flow rounds [default = %d]\n",                           pPars->nRounds );
    Abc_Print( -2, "\t-A num   : the number of exact area rounds (when \'-a\' is used) [default = %d]\n",    pPars->nRoundsEla );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",                    pPars->nRelaxRatio );
    Abc_Print( -2, "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",       pPars->nCoarseLimit );
    Abc_Print( -2, "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",       pPars->nAreaTuner );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n",                Buffer );
    Abc_Print( -2, "\t-Q num   : internal parameter impacting area of the mapping [default = %d]\n",         pPars->nReqTimeFlex );
    Abc_Print( -2, "\t-a       : toggles SAT-based area-oriented mapping (experimental) [default = %s]\n",   pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n",                     pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles pin permutation (more matches - better quality) [default = %s]\n",  pPars->fPinPerm? "yes": "no" );
    Abc_Print( -2, "\t-q       : toggles quick mapping (fewer matches - worse quality) [default = %s]\n",    pPars->fPinQuick? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggles filtering matches (useful with unit delay model) [default = %s]\n", pPars->fPinFilter? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n",                                   pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n",                              pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}